

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O0

void __thiscall
CodeGenWorkItem::OnRemoveFromJitQueue(CodeGenWorkItem *this,NativeCodeGenerator *generator)

{
  code *pcVar1;
  CodeGenWorkItemType CVar2;
  ExecutionMode EVar3;
  bool bVar4;
  ScriptContext *this_00;
  ThreadContext *this_01;
  EntryPointInfo *this_02;
  undefined4 *puVar5;
  FunctionBody *this_03;
  FunctionEntryPointInfo *entryPointInfo;
  JsLoopBodyCodeGen *loopBodyWorkItem;
  NativeCodeGenerator *generator_local;
  CodeGenWorkItem *this_local;
  
  this->isInJitQueue = false;
  Js::EntryPointInfo::SetCodeGenPending(this->entryPointInfo);
  this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this->functionBody);
  this_01 = Js::ScriptContext::GetThreadContext(this_00);
  ThreadContext::UnregisterCodeGenRecyclableData(this_01,this->recyclableData);
  this->recyclableData = (CodeGenRecyclableData *)0x0;
  CVar2 = Type(this);
  if (CVar2 == JsLoopBodyWorkItemType) {
    Js::LoopHeader::ResetInterpreterCount
              ((LoopHeader *)
               this[1].super_Job.super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
               previous);
    this_02 = GetEntryPoint(this);
    Js::EntryPointInfo::Reset(this_02,true);
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsLoopBodyCodeGen>
              (&Memory::HeapAllocator::Instance,(JsLoopBodyCodeGen *)this);
  }
  else {
    EVar3 = GetJitMode(this);
    if (EVar3 != FullJit) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.cpp"
                         ,0xc1,"(GetJitMode() == ExecutionMode::FullJit)",
                         "GetJitMode() == ExecutionMode::FullJit");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_03 = GetFunctionBody(this);
    entryPointInfo = (FunctionEntryPointInfo *)GetEntryPoint(this);
    Js::FunctionBody::OnFullJitDequeued(this_03,entryPointInfo);
    NativeCodeGenerator::AddWorkItem(generator,this);
  }
  return;
}

Assistant:

void CodeGenWorkItem::OnRemoveFromJitQueue(NativeCodeGenerator* generator)
{
    // This is called from within the lock

    this->isInJitQueue = false;
    this->entryPointInfo->SetCodeGenPending();
    functionBody->GetScriptContext()->GetThreadContext()->UnregisterCodeGenRecyclableData(this->recyclableData);
    this->recyclableData = nullptr;

    if(IS_JS_ETW(EventEnabledJSCRIPT_FUNCTION_JIT_DEQUEUED()))
    {
        WCHAR displayNameBuffer[256];
        WCHAR* displayName = displayNameBuffer;
        size_t sizeInChars = this->GetDisplayName(displayName, 256);
        if(sizeInChars > 256)
        {
            displayName = HeapNewArray(WCHAR, sizeInChars);
            this->GetDisplayName(displayName, 256);
        }
        JS_ETW(EventWriteJSCRIPT_FUNCTION_JIT_DEQUEUED(
            this->GetFunctionNumber(),
            displayName,
            this->GetScriptContext(),
            this->GetInterpretedCount()));

        if(displayName != displayNameBuffer)
        {
            HeapDeleteArray(sizeInChars, displayName);
        }
    }

    if(this->Type() == JsLoopBodyWorkItemType)
    {
        // Go ahead and delete it and let it re-queue if more interpreting of the loop happens
        auto loopBodyWorkItem = static_cast<JsLoopBodyCodeGen*>(this);
        loopBodyWorkItem->loopHeader->ResetInterpreterCount();
        loopBodyWorkItem->GetEntryPoint()->Reset(true);
        HeapDelete(loopBodyWorkItem);
    }
    else
    {
        Assert(GetJitMode() == ExecutionMode::FullJit); // simple JIT work items are not removed from the queue

        GetFunctionBody()->OnFullJitDequeued(static_cast<Js::FunctionEntryPointInfo *>(GetEntryPoint()));

        // Add it back to the list of available functions to be jitted
        generator->AddWorkItem(this);
    }
}